

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_named_parameters.cpp
# Opt level: O3

void duckdb::Binder::BindNamedParameters
               (named_parameter_type_map_t *types,named_parameter_map_t *values,
               QueryErrorContext *error_context,string *func_name)

{
  QueryErrorContext error_context_00;
  pointer pcVar1;
  iterator iVar2;
  BinderException *this;
  _Rb_tree_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  string error_msg;
  string named_params;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ordered_params;
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  string *local_120;
  QueryErrorContext *local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [24];
  _Rb_tree_node_base *local_58;
  
  p_Var4 = (values->_M_h)._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      iVar2 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&types->_M_h,(key_type *)(p_Var4 + 1));
      if (iVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_120 = func_name;
        local_118 = error_context;
        ::std::
        map<std::__cxx11::string,duckdb::LogicalType,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>
        ::
        map<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,false,true>>
                  ((map<std::__cxx11::string,duckdb::LogicalType,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>
                    *)local_70,
                   (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_false,_true>
                    )(types->_M_h)._M_before_begin._M_nxt,
                   (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_false,_true>
                    )0x0);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        local_f0._M_string_length = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        if (local_58 == (_Rb_tree_node_base *)(local_70 + 8)) {
          local_128 = &local_148.field_2;
          goto LAB_00711ad0;
        }
        local_128 = &local_148.field_2;
        p_Var3 = local_58;
        do {
          ::std::__cxx11::string::append((char *)&local_f0);
          ::std::__cxx11::string::_M_append((char *)&local_f0,*(ulong *)(p_Var3 + 1));
          ::std::__cxx11::string::append((char *)&local_f0);
          LogicalType::ToString_abi_cxx11_(&local_148,(LogicalType *)(p_Var3 + 2));
          ::std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)&local_f0);
          p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
        } while (p_Var3 != (_Rb_tree_node_base *)(local_70 + 8));
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        local_148._M_string_length = 0;
        local_148.field_2._M_local_buf[0] = '\0';
        if (local_f0._M_string_length == 0) {
LAB_00711ad0:
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          local_148.field_2._M_local_buf[0] = '\0';
          local_148._M_string_length = 0;
          ::std::__cxx11::string::operator=
                    ((string *)&local_148,"Function does not accept any named parameters.");
        }
        else {
          ::std::operator+(&local_110,"Candidates:\n",&local_f0);
          ::std::__cxx11::string::operator=((string *)&local_148,(string *)&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
        }
        this = (BinderException *)__cxa_allocate_exception(0x10);
        error_context_00.query_location.index = (optional_idx)(local_118->query_location).index;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Invalid named parameter \"%s\" for function %s\n%s","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,p_Var4[1]._M_nxt,
                   (long)&(p_Var4[1]._M_nxt)->_M_nxt + (long)&(p_Var4[2]._M_nxt)->_M_nxt);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        pcVar1 = (local_120->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + local_120->_M_string_length);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_148._M_dataplus._M_p,
                   local_148._M_dataplus._M_p + local_148._M_string_length);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (this,error_context_00,&local_110,&local_90,&local_b0,&local_d0);
        __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (*(char *)((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                          ._M_cur + 0x28) != '\x03') {
        Value::DefaultCastAs
                  ((Value *)local_70,(Value *)(p_Var4 + 5),
                   (LogicalType *)
                   ((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                          ._M_cur + 0x28),false);
        Value::operator=((Value *)(p_Var4 + 5),(Value *)local_70);
        Value::~Value((Value *)local_70);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Binder::BindNamedParameters(named_parameter_type_map_t &types, named_parameter_map_t &values,
                                 QueryErrorContext &error_context, string &func_name) {
	for (auto &kv : values) {
		auto entry = types.find(kv.first);
		if (entry == types.end()) {
			auto ordered_params = order_case_insensitive_map(types);
			// create a list of named parameters for the error
			string named_params;
			for (auto &kv_ordered_params : ordered_params) {
				named_params += "    ";
				named_params += kv_ordered_params.first;
				named_params += " ";
				named_params += kv_ordered_params.second.ToString();
				named_params += "\n";
			}
			string error_msg;
			if (named_params.empty()) {
				error_msg = "Function does not accept any named parameters.";
			} else {
				error_msg = "Candidates:\n" + named_params;
			}
			throw BinderException(error_context, "Invalid named parameter \"%s\" for function %s\n%s", kv.first,
			                      func_name, error_msg);
		}
		if (entry->second.id() != LogicalTypeId::ANY) {
			kv.second = kv.second.DefaultCastAs(entry->second);
		}
	}
}